

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O2

void __thiscall
re2c::Skeleton::emit_start
          (Skeleton *this,OutputFile *o,size_t maxfill,bool backup,bool backupctx,bool accept)

{
  type_t tVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  rule_rank_t r;
  uint32_t n;
  opt_t *poVar4;
  OutputFile *pOVar5;
  undefined7 in_register_00000009;
  char *expr;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  size_t sStack_80;
  allocator<char> local_71;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  size_t local_60;
  size_t local_58;
  string local_50;
  
  expr = (char *)CONCAT71(in_register_00000009,backup);
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  tVar1 = (poVar4->encoding).type_;
  if (tVar1 < (UTF32|UCS2)) {
    expr = (char *)0x23;
    if ((0x23U >> (tVar1 & 0x1f) & 1) != 0) {
      sStack_80 = 1;
      local_70 = 0;
      goto LAB_0013ca36;
    }
    expr = (char *)0xc;
    if ((0xcU >> (tVar1 & 0x1f) & 1) == 0) goto LAB_0013ca2d;
    sStack_80 = 2;
  }
  else {
LAB_0013ca2d:
    sStack_80 = 4;
  }
  local_70 = (undefined4)CONCAT71((uint7)(uint3)(tVar1 >> 8),1);
LAB_0013ca36:
  local_68 = CONCAT31(in_register_00000089,accept);
  local_58 = maxfill;
  r = rule_rank_t::none();
  n = rule2key(this,r);
  OutputFile::ws(o,"\n#define YYCTYPE ");
  exact_uint(o,sStack_80);
  OutputFile::ws(o,"\n#define YYKEYTYPE ");
  exact_uint(o,this->sizeof_key);
  OutputFile::ws(o,"\n#define YYPEEK() *cursor");
  OutputFile::ws(o,"\n#define YYSKIP() ++cursor");
  if (backup) {
    OutputFile::ws(o,"\n#define YYBACKUP() marker = cursor");
    OutputFile::ws(o,"\n#define YYRESTORE() cursor = marker");
  }
  local_64 = SUB84((char *)CONCAT71(in_register_00000009,backup),0);
  local_6c = CONCAT31(in_register_00000081,backupctx);
  local_60 = sStack_80;
  if (backupctx) {
    OutputFile::ws(o,"\n#define YYBACKUPCTX() ctxmarker = cursor");
    OutputFile::ws(o,"\n#define YYRESTORECTX() cursor = ctxmarker");
  }
  OutputFile::ws(o,"\n#define YYLESSTHAN(n) (limit - cursor) < n");
  OutputFile::ws(o,"\n#define YYFILL(n) { break; }");
  OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::ws(o,"\nstatic int action_");
  OutputFile::wstring(pOVar5,&this->name);
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"( unsigned int i");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,", const YYKEYTYPE *keys");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,", const YYCTYPE *start");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,", const YYCTYPE *token");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,", const YYCTYPE **cursor");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,", YYKEYTYPE rule_act");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,")");
  OutputFile::ws(o,"\n{");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const long pos = token - start;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const long len_act = *cursor - token;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const long len_exp = (long) keys [3 * i + 1];");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const YYKEYTYPE rule_exp = keys [3 * i + 2];");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  pOVar5 = OutputFile::ws(pOVar5,"if (rule_exp == ");
  pOVar5 = OutputFile::wu32(pOVar5,n);
  OutputFile::ws(pOVar5,") {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"fprintf");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,"( stderr");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  pOVar5 = OutputFile::ws(pOVar5,", \"warning: lex_");
  pOVar5 = OutputFile::wstring(pOVar5,&this->name);
  OutputFile::ws(pOVar5,": control flow is undefined for input\"");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,4);
  OutputFile::ws(pOVar5,"\" at position %ld, rerun re2c with \'-W\'\\n\"");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", pos");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,");");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"}");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"if (len_act == len_exp && rule_act == rule_exp) {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"const YYKEYTYPE offset = keys[3 * i];");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"*cursor = token + offset;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"return 0;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"} else {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"fprintf");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,"( stderr");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  pOVar5 = OutputFile::ws(pOVar5,", \"error: lex_");
  pOVar5 = OutputFile::wstring(pOVar5,&this->name);
  OutputFile::ws(pOVar5,": at position %ld (iteration %u):\\n\"");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,4);
  OutputFile::ws(pOVar5,"\"\\texpected: match length %ld, rule %u\\n\"");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,4);
  OutputFile::ws(pOVar5,"\"\\tactual:   match length %ld, rule %u\\n\"");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", pos");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", i");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", len_exp");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", rule_exp");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", len_act");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,", rule_act");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,3);
  OutputFile::ws(pOVar5,");");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"return 1;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"}");
  OutputFile::ws(o,"\n}");
  OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::ws(o,"\nint lex_");
  pOVar5 = OutputFile::wstring(pOVar5,&this->name);
  OutputFile::ws(pOVar5,"()");
  OutputFile::ws(o,"\n{");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  pOVar5 = OutputFile::ws(pOVar5,"const size_t padding = ");
  pOVar5 = OutputFile::wu64(pOVar5,local_58);
  OutputFile::ws(pOVar5,"; /* YYMAXFILL */");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"int status = 0;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"size_t input_len = 0;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"size_t keys_count = 0;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"YYCTYPE *input = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"YYKEYTYPE *keys = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const YYCTYPE *cursor = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const YYCTYPE *limit = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const YYCTYPE *token = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"const YYCTYPE *eof = NULL;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"unsigned int i = 0;");
  OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"input = (YYCTYPE *) read_file");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  pOVar5 = OutputFile::ws(pOVar5,"(\"");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,o->file_name,&local_71);
  pOVar5 = OutputFile::wstring(pOVar5,&local_50);
  pOVar5 = OutputFile::ws(pOVar5,".");
  pOVar5 = OutputFile::wstring(pOVar5,&this->name);
  OutputFile::ws(pOVar5,".input\"");
  std::__cxx11::string::~string((string *)&local_50);
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", sizeof (YYCTYPE)");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", padding");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", &input_len");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,");");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"if (input == NULL) {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"status = 1;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"goto end;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"}");
  OutputFile::ws(o,"\n");
  uVar3 = local_64;
  if ((char)local_70 != '\0') {
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,1);
    OutputFile::ws(pOVar5,"for (i = 0; i < input_len; ++i) {");
    from_le(o,(uint32_t)local_60,0x151d53,expr);
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,1);
    OutputFile::ws(pOVar5,"}");
    OutputFile::ws(o,"\n");
  }
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"keys = (YYKEYTYPE *) read_file");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  pOVar5 = OutputFile::ws(pOVar5,"(\"");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,o->file_name,&local_71);
  pOVar5 = OutputFile::wstring(pOVar5,&local_50);
  pOVar5 = OutputFile::ws(pOVar5,".");
  pOVar5 = OutputFile::wstring(pOVar5,&this->name);
  OutputFile::ws(pOVar5,".keys\"");
  std::__cxx11::string::~string((string *)&local_50);
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", 3 * sizeof (YYKEYTYPE)");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", 0");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,", &keys_count");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,");");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"if (keys == NULL) {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"status = 1;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"goto end;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"}");
  OutputFile::ws(o,"\n");
  if (1 < this->sizeof_key) {
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,1);
    OutputFile::ws(pOVar5,"for (i = 0; i < 3 * keys_count; ++i) {");
    from_le(o,(uint32_t)this->sizeof_key,0x151de8,expr);
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,1);
    OutputFile::ws(pOVar5,"}");
    OutputFile::ws(o,"\n");
  }
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"cursor = input;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"limit = input + input_len + padding;");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"eof = input + input_len;");
  OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,1);
  OutputFile::ws(pOVar5,"for (i = 0; status == 0 && i < keys_count; ++i) {");
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"token = cursor;");
  uVar2 = local_68;
  if ((char)uVar3 != '\0') {
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,2);
    OutputFile::ws(pOVar5,"const YYCTYPE *marker = NULL;");
  }
  if ((char)local_6c != '\0') {
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,2);
    OutputFile::ws(pOVar5,"const YYCTYPE *ctxmarker = NULL;");
  }
  pOVar5 = OutputFile::ws(o,"\n");
  pOVar5 = OutputFile::wind(pOVar5,2);
  OutputFile::ws(pOVar5,"YYCTYPE yych;");
  if ((char)uVar2 != '\0') {
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,2);
    OutputFile::ws(pOVar5,"unsigned int yyaccept = 0;");
  }
  OutputFile::ws(o,"\n");
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if ((poVar4->bFlag == true) && (BitMap::first != 0)) {
    realopt_t::operator->((realopt_t *)&DAT_00166888);
    BitMap::gen(o,2,0,0x100);
  }
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void Skeleton::emit_start
	( OutputFile & o
	, size_t maxfill
	, bool backup
	, bool backupctx
	, bool accept
	) const
{
	const size_t sizeof_cunit = opts->encoding.szCodeUnit();
	const uint32_t default_rule = rule2key (rule_rank_t::none ());

	o.ws("\n#define YYCTYPE ");
	exact_uint (o, sizeof_cunit);
	o.ws("\n#define YYKEYTYPE ");
	exact_uint (o, sizeof_key);
	o.ws("\n#define YYPEEK() *cursor");
	o.ws("\n#define YYSKIP() ++cursor");
	if (backup)
	{
		o.ws("\n#define YYBACKUP() marker = cursor");
		o.ws("\n#define YYRESTORE() cursor = marker");
	}
	if (backupctx)
	{
		o.ws("\n#define YYBACKUPCTX() ctxmarker = cursor");
		o.ws("\n#define YYRESTORECTX() cursor = ctxmarker");
	}
	o.ws("\n#define YYLESSTHAN(n) (limit - cursor) < n");
	o.ws("\n#define YYFILL(n) { break; }");
	o.ws("\n");
	o.ws("\nstatic int action_").wstring(name);
	o.ws("\n").wind(1).ws("( unsigned int i");
	o.ws("\n").wind(1).ws(", const YYKEYTYPE *keys");
	o.ws("\n").wind(1).ws(", const YYCTYPE *start");
	o.ws("\n").wind(1).ws(", const YYCTYPE *token");
	o.ws("\n").wind(1).ws(", const YYCTYPE **cursor");
	o.ws("\n").wind(1).ws(", YYKEYTYPE rule_act");
	o.ws("\n").wind(1).ws(")");
	o.ws("\n{");
	o.ws("\n").wind(1).ws("const long pos = token - start;");
	o.ws("\n").wind(1).ws("const long len_act = *cursor - token;");
	o.ws("\n").wind(1).ws("const long len_exp = (long) keys [3 * i + 1];");
	o.ws("\n").wind(1).ws("const YYKEYTYPE rule_exp = keys [3 * i + 2];");
	o.ws("\n").wind(1).ws("if (rule_exp == ").wu32(default_rule).ws(") {");
	o.ws("\n").wind(2).ws("fprintf");
	o.ws("\n").wind(3).ws("( stderr");
	o.ws("\n").wind(3).ws(", \"warning: lex_").wstring(name).ws(": control flow is undefined for input\"");
	o.ws("\n").wind(4).ws("\" at position %ld, rerun re2c with '-W'\\n\"");
	o.ws("\n").wind(3).ws(", pos");
	o.ws("\n").wind(3).ws(");");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n").wind(1).ws("if (len_act == len_exp && rule_act == rule_exp) {");
	o.ws("\n").wind(2).ws("const YYKEYTYPE offset = keys[3 * i];");
	o.ws("\n").wind(2).ws("*cursor = token + offset;");
	o.ws("\n").wind(2).ws("return 0;");
	o.ws("\n").wind(1).ws("} else {");
	o.ws("\n").wind(2).ws("fprintf");
	o.ws("\n").wind(3).ws("( stderr");
	o.ws("\n").wind(3).ws(", \"error: lex_").wstring(name).ws(": at position %ld (iteration %u):\\n\"");
	o.ws("\n").wind(4).ws("\"\\texpected: match length %ld, rule %u\\n\"");
	o.ws("\n").wind(4).ws("\"\\tactual:   match length %ld, rule %u\\n\"");
	o.ws("\n").wind(3).ws(", pos");
	o.ws("\n").wind(3).ws(", i");
	o.ws("\n").wind(3).ws(", len_exp");
	o.ws("\n").wind(3).ws(", rule_exp");
	o.ws("\n").wind(3).ws(", len_act");
	o.ws("\n").wind(3).ws(", rule_act");
	o.ws("\n").wind(3).ws(");");
	o.ws("\n").wind(2).ws("return 1;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n}");
	o.ws("\n");
	o.ws("\nint lex_").wstring(name).ws("()");
	o.ws("\n{");
	o.ws("\n").wind(1).ws("const size_t padding = ").wu64(maxfill).ws("; /* YYMAXFILL */");
	o.ws("\n").wind(1).ws("int status = 0;");
	o.ws("\n").wind(1).ws("size_t input_len = 0;");
	o.ws("\n").wind(1).ws("size_t keys_count = 0;");
	o.ws("\n").wind(1).ws("YYCTYPE *input = NULL;");
	o.ws("\n").wind(1).ws("YYKEYTYPE *keys = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *cursor = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *limit = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *token = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *eof = NULL;");
	o.ws("\n").wind(1).ws("unsigned int i = 0;");
	o.ws("\n");
	o.ws("\n").wind(1).ws("input = (YYCTYPE *) read_file");
	o.ws("\n").wind(2).ws("(\"").wstring(o.file_name).ws(".").wstring(name).ws(".input\"");
	o.ws("\n").wind(2).ws(", sizeof (YYCTYPE)");
	o.ws("\n").wind(2).ws(", padding");
	o.ws("\n").wind(2).ws(", &input_len");
	o.ws("\n").wind(2).ws(");");
	o.ws("\n").wind(1).ws("if (input == NULL) {");
	o.ws("\n").wind(2).ws("status = 1;");
	o.ws("\n").wind(2).ws("goto end;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n");
	if (sizeof_cunit > 1)
	{
		o.ws("\n").wind(1).ws("for (i = 0; i < input_len; ++i) {");
		from_le(o, 2, sizeof_cunit, "input[i]");
		o.ws("\n").wind(1).ws("}");
		o.ws("\n");
	}
	o.ws("\n").wind(1).ws("keys = (YYKEYTYPE *) read_file");
	o.ws("\n").wind(2).ws("(\"").wstring(o.file_name).ws(".").wstring(name).ws(".keys\"");
	o.ws("\n").wind(2).ws(", 3 * sizeof (YYKEYTYPE)");
	o.ws("\n").wind(2).ws(", 0");
	o.ws("\n").wind(2).ws(", &keys_count");
	o.ws("\n").wind(2).ws(");");
	o.ws("\n").wind(1).ws("if (keys == NULL) {");
	o.ws("\n").wind(2).ws("status = 1;");
	o.ws("\n").wind(2).ws("goto end;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n");
	if (sizeof_key > 1)
	{
		o.ws("\n").wind(1).ws("for (i = 0; i < 3 * keys_count; ++i) {");
		from_le(o, 2, sizeof_key, "keys[i]");
		o.ws("\n").wind(1).ws("}");
		o.ws("\n");
	}
	o.ws("\n").wind(1).ws("cursor = input;");
	o.ws("\n").wind(1).ws("limit = input + input_len + padding;");
	o.ws("\n").wind(1).ws("eof = input + input_len;");
	o.ws("\n");
	o.ws("\n").wind(1).ws("for (i = 0; status == 0 && i < keys_count; ++i) {");
	o.ws("\n").wind(2).ws("token = cursor;");
	if (backup)
	{
		o.ws("\n").wind(2).ws("const YYCTYPE *marker = NULL;");
	}
	if (backupctx)
	{
		o.ws("\n").wind(2).ws("const YYCTYPE *ctxmarker = NULL;");
	}
	o.ws("\n").wind(2).ws("YYCTYPE yych;");
	if (accept)
	{
		o.ws("\n").wind(2).ws("unsigned int yyaccept = 0;");
	}
	o.ws("\n");
	if (opts->bFlag && BitMap::first)
	{
		BitMap::gen (o, 2, 0, std::min (0x100u, opts->encoding.nCodeUnits ()));
	}
	o.ws("\n");
}